

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

void __thiscall CEditor::RenderImagesList(CEditor *this,CUIRect ToolBox)

{
  CEditorImage **pID;
  uint uVar1;
  long lVar2;
  CLayerGroup *pCVar3;
  CLayer *pCVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  char *pText;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long in_FS_OFFSET;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float local_68;
  undefined8 local_64;
  float local_5c;
  CUIRect Slot;
  CUIRect ToolBox_local;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  fVar17 = (float)(this->m_Map).m_lImages.num_elements * 14.0 + 40.0 + 17.0;
  fVar18 = fVar17 - ToolBox.h;
  ToolBox_local = ToolBox;
  if (fVar18 <= 0.0) {
    fVar18 = 0.0;
    RenderImagesList::s_ScrollValue = 0.0;
  }
  else {
    CUIRect::VSplitRight(&ToolBox_local,15.0,&ToolBox_local,&Slot);
    CUIRect::VSplitRight(&ToolBox_local,3.0,&ToolBox_local,(CUIRect *)0x0);
    RenderImagesList::s_ScrollValue =
         CUI::DoScrollbarV(&this->m_UI,&RenderImagesList::s_ScrollValue,&Slot,
                           RenderImagesList::s_ScrollValue);
    bVar6 = CUIRect::Inside(&Slot,(this->m_UI).m_MouseX,(this->m_UI).m_MouseY);
    if ((bVar6) ||
       (bVar6 = CUIRect::Inside(&ToolBox_local,(this->m_UI).m_MouseX,(this->m_UI).m_MouseY), bVar6))
    {
      iVar9 = (int)((fVar17 - ToolBox_local.h) / 14.0);
      if (-1 < iVar9) {
        iVar9 = iVar9 + 1;
        iVar7 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x1a4,0);
        if ((char)iVar7 != '\0') {
          fVar15 = RenderImagesList::s_ScrollValue - 1.0 / (float)iVar9;
          fVar16 = 1.0;
          if (fVar15 <= 1.0) {
            fVar16 = fVar15;
          }
          RenderImagesList::s_ScrollValue = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar16);
        }
        iVar7 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x1a5,0);
        if ((char)iVar7 != '\0') {
          fVar15 = 1.0 / (float)iVar9 + RenderImagesList::s_ScrollValue;
          fVar16 = 1.0;
          if (fVar15 <= 1.0) {
            fVar16 = fVar15;
          }
          RenderImagesList::s_ScrollValue = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar16);
        }
      }
    }
  }
  fVar16 = fVar18 * RenderImagesList::s_ScrollValue;
  fVar17 = (RenderImagesList::s_ScrollValue + -1.0) * fVar18 + fVar17;
  pText = "Embedded";
  fVar18 = 0.0;
  bVar6 = true;
  do {
    bVar5 = bVar6;
    fVar15 = fVar18 + 15.0;
    if (fVar17 < fVar15) goto LAB_0019b276;
    if (fVar16 <= fVar18) {
      CUIRect::HSplitTop(&ToolBox_local,15.0,&Slot,&ToolBox_local);
      CUI::DoLabel(&this->m_UI,&Slot,pText,12.0,1,-1.0,true);
    }
    iVar9 = (this->m_Map).m_lImages.num_elements;
    if (0 < iVar9) {
      uVar10 = 0;
      do {
        iVar7 = (this->m_Map).m_lImages.list[uVar10]->m_External;
        if (bVar5) {
          if (iVar7 == 0) {
LAB_0019af6b:
            fVar18 = fVar15 + 14.0;
            if (fVar17 < fVar18) goto LAB_0019b276;
            bVar6 = fVar16 <= fVar15;
            fVar15 = fVar18;
            if (bVar6) {
              CUIRect::HSplitTop(&ToolBox_local,12.0,&Slot,&ToolBox_local);
              uVar8 = (ulong)(this->m_Map).m_lGroups.num_elements;
              if ((long)uVar8 < 1) {
                bVar6 = false;
              }
              else {
                uVar11 = 0;
                bVar6 = false;
                while (!bVar6) {
                  pCVar3 = (this->m_Map).m_lGroups.list[uVar11];
                  uVar1 = (pCVar3->m_lLayers).num_elements;
                  uVar12 = (ulong)uVar1;
                  if ((int)uVar1 < 1) {
                    uVar12 = 0;
                  }
                  uVar13 = 0;
                  while (uVar12 != uVar13) {
                    pCVar4 = (pCVar3->m_lLayers).list[uVar13];
                    iVar9 = pCVar4->m_Type;
                    if (iVar9 == 2) {
                      lVar14 = 0x30;
LAB_0019b008:
                      if (uVar10 == *(uint *)(pCVar4->m_aName + lVar14 + -0x10)) {
                        bVar6 = true;
                      }
                    }
                    else if (iVar9 == 3) {
                      lVar14 = 0x28;
                      goto LAB_0019b008;
                    }
                    uVar13 = uVar13 + 1;
                    if (bVar6 != false) goto LAB_0019b02d;
                  }
                  if ((bVar6 != false) || (uVar11 = uVar11 + 1, uVar8 <= uVar11)) goto LAB_0019b033;
                }
LAB_0019b02d:
                bVar6 = true;
              }
LAB_0019b033:
              pID = (this->m_Map).m_lImages.list + uVar10;
              iVar9 = DoButton_Image(this,pID,(*pID)->m_aName,
                                     (uint)(uVar10 == (uint)this->m_SelectedImage),&Slot,1,
                                     "Select image",bVar6);
              if ((iVar9 != 0) && (this->m_SelectedImage = (int)uVar10, iVar9 == 2)) {
                CUI::DoPopupMenu(&this->m_UI,(int)(this->m_UI).m_MouseX,(int)(this->m_UI).m_MouseY,
                                 0x78,0x50,this,PopupImage,0xf);
              }
              CUIRect::HSplitTop(&ToolBox_local,2.0,(CUIRect *)0x0,&ToolBox_local);
              iVar9 = (this->m_Map).m_lImages.num_elements;
            }
          }
        }
        else if (iVar7 != 0) goto LAB_0019af6b;
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)iVar9);
    }
    fVar18 = fVar15 + 5.0;
    if (fVar17 < fVar18) goto LAB_0019b276;
    CUIRect::HSplitTop(&ToolBox_local,5.0,&Slot,&ToolBox_local);
    local_68 = Slot.x;
    local_5c = Slot.h * 0.5 + Slot.y;
    local_64 = CONCAT44(Slot.x + Slot.w,local_5c);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])(this->m_pGraphics,0xffffffff);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x14])();
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x16])(this->m_pGraphics,&local_68,1);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x15])();
    pText = "External";
    bVar6 = false;
  } while (bVar5);
  if (fVar18 + 17.0 <= fVar17) {
    CUIRect::HSplitTop(&ToolBox_local,5.0,&Slot,&ToolBox_local);
    CUIRect::HSplitTop(&ToolBox_local,12.0,&Slot,&ToolBox_local);
    iVar9 = DoButton_Editor(this,&RenderImagesList::s_NewImageButton,"Add",0,&Slot,0,
                            "Load a new image to use in the map");
    if (iVar9 != 0) {
      InvokeFileDialog(this,-1,1,"Add Image","Add","mapres","",AddImage,this);
    }
  }
LAB_0019b276:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::RenderImagesList(CUIRect ToolBox)
{
	static float s_ScrollValue = 0.0f;
	const float RowHeight = 14.0f;
	const float HeaderHeight = RowHeight + 1.0f;
	const float HeaderSeparatorHeight = 5.0f;
	const float AddButtonHeight = 17.0f;
	const float ImagesHeight = 2 * (HeaderHeight + HeaderSeparatorHeight) + RowHeight * m_Map.m_lImages.size() + AddButtonHeight;
	const float ScrollDifference = maximum(ImagesHeight - ToolBox.h, 0.0f);

	if(ScrollDifference > 0) // Do we even need a scrollbar?
	{
		CUIRect Scroll;
		ToolBox.VSplitRight(15.0f, &ToolBox, &Scroll);
		ToolBox.VSplitRight(3.0f, &ToolBox, 0);	// extra spacing
		s_ScrollValue = UI()->DoScrollbarV(&s_ScrollValue, &Scroll, s_ScrollValue);
		if(UI()->MouseInside(&Scroll) || UI()->MouseInside(&ToolBox))
		{
			int ScrollNum = (int)((ImagesHeight-ToolBox.h)/RowHeight)+1;
			if(ScrollNum > 0)
			{
				if(Input()->KeyPress(KEY_MOUSE_WHEEL_UP))
					s_ScrollValue = clamp(s_ScrollValue - 1.0f/ScrollNum, 0.0f, 1.0f);
				if(Input()->KeyPress(KEY_MOUSE_WHEEL_DOWN))
					s_ScrollValue = clamp(s_ScrollValue + 1.0f/ScrollNum, 0.0f, 1.0f);
			}
		}
	}
	else
		s_ScrollValue = 0.0f;

	const float ImageStartAt = ScrollDifference * s_ScrollValue;
	const float ImageStopAt = ImagesHeight + ScrollDifference * (s_ScrollValue - 1.0f);
	float ImageCur = 0.0f;

	for(int e = 0; e < 2; e++) // two passes, first embedded, then external
	{
		if(ImageCur + HeaderHeight > ImageStopAt)
			return;

		CUIRect Slot;
		if(ImageCur >= ImageStartAt)
		{
			ToolBox.HSplitTop(HeaderHeight, &Slot, &ToolBox);
			UI()->DoLabel(&Slot, e == 0 ? "Embedded" : "External", 12.0f, TEXTALIGN_CENTER);
		}
		ImageCur += HeaderHeight;

		for(int i = 0; i < m_Map.m_lImages.size(); i++)
		{
			if((e && !m_Map.m_lImages[i]->m_External) || (!e && m_Map.m_lImages[i]->m_External))
				continue;

			if(ImageCur + RowHeight > ImageStopAt)
				return;
			else if(ImageCur < ImageStartAt)
			{
				ImageCur += RowHeight;
				continue;
			}
			ImageCur += RowHeight;

			ToolBox.HSplitTop(12.0f, &Slot, &ToolBox);

			// check if images is used
			bool Used = false;
			for(int g = 0; !Used && (g < m_Map.m_lGroups.size()); g++)
			{
				CLayerGroup *pGroup = m_Map.m_lGroups[g];
				for(int l = 0; !Used && l < pGroup->m_lLayers.size(); l++)
				{
					if(pGroup->m_lLayers[l]->m_Type == LAYERTYPE_TILES)
					{
						CLayerTiles *pLayer = static_cast<CLayerTiles *>(pGroup->m_lLayers[l]);
						if(pLayer->m_Image == i)
							Used = true;
					}
					else if(pGroup->m_lLayers[l]->m_Type == LAYERTYPE_QUADS)
					{
						CLayerQuads *pLayer = static_cast<CLayerQuads *>(pGroup->m_lLayers[l]);
						if(pLayer->m_Image == i)
							Used = true;
					}
				}
			}

			if(int Result = DoButton_Image(&m_Map.m_lImages[i], m_Map.m_lImages[i]->m_aName, m_SelectedImage == i, &Slot, BUTTON_CONTEXT, "Select image", Used))
			{
				m_SelectedImage = i;

				if(Result == 2)
					UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 120, 80, this, PopupImage);
			}

			ToolBox.HSplitTop(2.0f, 0, &ToolBox);
		}

		// separator
		if(ImageCur + HeaderSeparatorHeight > ImageStopAt)
			return;
		ToolBox.HSplitTop(HeaderSeparatorHeight, &Slot, &ToolBox);
		ImageCur += HeaderSeparatorHeight;
		IGraphics::CLineItem LineItem(Slot.x, Slot.y+Slot.h/2, Slot.x+Slot.w, Slot.y+Slot.h/2);
		Graphics()->TextureClear();
		Graphics()->LinesBegin();
		Graphics()->LinesDraw(&LineItem, 1);
		Graphics()->LinesEnd();
	}

	if(ImageCur + AddButtonHeight > ImageStopAt)
		return;

	// new image
	static int s_NewImageButton = 0;
	CUIRect Slot;
	ToolBox.HSplitTop(5.0f, &Slot, &ToolBox);
	ToolBox.HSplitTop(12.0f, &Slot, &ToolBox);
	if(DoButton_Editor(&s_NewImageButton, "Add", 0, &Slot, 0, "Load a new image to use in the map"))
		InvokeFileDialog(IStorage::TYPE_ALL, FILETYPE_IMG, "Add Image", "Add", "mapres", "", AddImage, this);
}